

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall DStrifeStatusBar::Draw(DStrifeStatusBar *this,EHudState state)

{
  DBaseStatusBar::Draw(&this->super_DBaseStatusBar,state);
  if (state == HUD_Fullscreen) {
    ST_SetNeedRefresh();
    DrawFullScreenStuff(this);
  }
  else if (state == HUD_StatusBar) {
    if (SB_state != 0) {
      SB_state = SB_state + -1;
    }
    DrawMainBar(this);
    return;
  }
  if ((this->CurrentPop != 0) && (this->PopHeight < 0)) {
    DrawPopScreen(this,(screen->super_DSimpleCanvas).super_DCanvas.Height);
    return;
  }
  return;
}

Assistant:

void Draw (EHudState state)
	{
		DBaseStatusBar::Draw (state);

		if (state == HUD_StatusBar)
		{
			if (SB_state != 0)
			{
				SB_state--;
			}
			DrawMainBar ();
		}
		else
		{
			if (state == HUD_Fullscreen)
			{
				ST_SetNeedRefresh();
				DrawFullScreenStuff ();
			}

			// Draw pop screen (log, keys, and status)
			if (CurrentPop != POP_None && PopHeight < 0)
			{
				DrawPopScreen (screen->GetHeight());
			}
		}
	}